

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

void __thiscall IR::Instr::TransferTo(Instr *this,Instr *instr)

{
  ushort uVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  StackSym *pSVar7;
  StackSym *pSVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  
  if (instr->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xc64,"(instr->m_dst == nullptr)","instr->m_dst == nullptr");
    if (!bVar4) goto LAB_00484196;
    *puVar5 = 0;
  }
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xc65,"(instr->m_src1 == nullptr)","instr->m_src1 == nullptr");
    if (!bVar4) goto LAB_00484196;
    *puVar5 = 0;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xc66,"(instr->m_src2 == nullptr)","instr->m_src2 == nullptr");
    if (!bVar4) goto LAB_00484196;
    *puVar5 = 0;
  }
  TransferDstAttributesTo(this,instr);
  uVar9 = *(ushort *)&this->field_0x36 & 0x10;
  uVar1 = *(ushort *)&instr->field_0x36;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xffef | uVar9;
  instr->field_0x38 = instr->field_0x38 & 0xf7 | this->field_0x38 & 8;
  uVar10 = *(ushort *)&this->field_0x36 & 0x40;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xffaf | uVar9 | uVar10;
  uVar11 = *(ushort *)&this->field_0x36 & 0x80;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xff2f | uVar9 | uVar10 | uVar11;
  uVar12 = *(ushort *)&this->field_0x36 & 0x100;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xfe2f | uVar9 | uVar10 | uVar11 | uVar12;
  instr->ignoreOverflowBitCount = this->ignoreOverflowBitCount;
  uVar13 = *(ushort *)&this->field_0x36 & 0x400;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xfa2f | uVar9 | uVar10 | uVar11 | uVar12 | uVar13;
  uVar14 = *(ushort *)&this->field_0x36 & 0x800;
  *(ushort *)&instr->field_0x36 = uVar1 & 61999 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14
  ;
  uVar15 = *(ushort *)&this->field_0x36 & 0x1000;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0xe22f | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15;
  instr->m_number = this->m_number;
  pOVar2 = this->m_src2;
  instr->m_src1 = this->m_src1;
  instr->m_src2 = pOVar2;
  uVar16 = *(ushort *)&this->field_0x36 & 0x4000;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0xa22f | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16;
  uVar17 = *(ushort *)&this->field_0x36 & 0x8000;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0x222f | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 |
       uVar17;
  instr->dataWidth = this->dataWidth;
  uVar18 = *(ushort *)&this->field_0x36 & 0x2000;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0x22f | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 | uVar17
       | uVar18;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0x2f | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 | uVar17
       | uVar18 | *(ushort *)&this->field_0x36 & 0x200;
  pOVar2 = this->m_dst;
  if (pOVar2 != (Opnd *)0x0) {
    instr->m_dst = pOVar2;
    this->m_dst = (Opnd *)0x0;
    bVar4 = Opnd::IsRegOpnd(pOVar2);
    if (bVar4) {
      pRVar6 = Opnd::AsRegOpnd(pOVar2);
      pSVar8 = pRVar6->m_sym;
      if ((pSVar8->super_Sym).m_kind == SymKindStack) {
        pSVar7 = Sym::AsStackSym(&pSVar8->super_Sym);
        if ((pSVar7->field_0x18 & 1) != 0) {
          pSVar7 = Sym::AsStackSym(&pSVar8->super_Sym);
          if ((pSVar7->field_5).m_instrDef != this) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                               ,0xc84,"(sym->AsStackSym()->m_instrDef == this)",
                               "sym->AsStackSym()->m_instrDef == this");
            if (!bVar4) {
LAB_00484196:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar5 = 0;
          }
          pSVar8 = Sym::AsStackSym(&pSVar8->super_Sym);
          (pSVar8->field_5).m_instrDef = instr;
        }
      }
    }
  }
  this->m_src1 = (Opnd *)0x0;
  this->m_src2 = (Opnd *)0x0;
  return;
}

Assistant:

void
Instr::TransferTo(Instr * instr)
{
    Assert(instr->m_dst == nullptr);
    Assert(instr->m_src1 == nullptr);
    Assert(instr->m_src2 == nullptr);
    this->TransferDstAttributesTo(instr);
    instr->usesStackArgumentsObject = this->usesStackArgumentsObject;
    instr->isCloned = this->isCloned;
    instr->ignoreNegativeZero = this->ignoreNegativeZero;
    instr->ignoreIntOverflow = this->ignoreIntOverflow;
    instr->ignoreIntOverflowInRange = this->ignoreIntOverflowInRange;
    instr->ignoreOverflowBitCount = this->ignoreOverflowBitCount;
    instr->loadedArrayHeadSegment = this->loadedArrayHeadSegment;
    instr->loadedArrayHeadSegmentLength = this->loadedArrayHeadSegmentLength;
    instr->extractedUpperBoundCheckWithoutHoisting = this->extractedUpperBoundCheckWithoutHoisting;
    instr->m_number = this->m_number;
    instr->m_src1 = this->m_src1;
    instr->m_src2 = this->m_src2;
    instr->dstIsAlwaysConvertedToInt32 = this->dstIsAlwaysConvertedToInt32;
    instr->dstIsAlwaysConvertedToNumber = this->dstIsAlwaysConvertedToNumber;
    instr->dataWidth = this->dataWidth;
    instr->isCtorCall = this->isCtorCall;
    instr->forcePreOpBailOutIfNeeded = this->forcePreOpBailOutIfNeeded;
    IR::Opnd * dst = this->m_dst;

    if (dst)
    {
        instr->m_dst = dst;
        this->m_dst = nullptr;
        if (dst->IsRegOpnd())
        {
            Sym * sym = dst->AsRegOpnd()->m_sym;
            if (sym->IsStackSym() && sym->AsStackSym()->m_isSingleDef)
            {
                Assert(sym->AsStackSym()->m_instrDef == this);
                StackSym * stackSym = sym->AsStackSym();
                stackSym->m_instrDef = instr;
            }
        }
    }

    this->m_src1 = nullptr;
    this->m_src2 = nullptr;
}